

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::parsing::TokenKind>::emplace_back<slang::parsing::TokenKind_const&>
          (SmallVectorBase<slang::parsing::TokenKind> *this,TokenKind *args)

{
  iterator pTVar1;
  TokenKind *in_RSI;
  SmallVectorBase<slang::parsing::TokenKind> *in_RDI;
  TokenKind *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::parsing::TokenKind> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::parsing::TokenKind_const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pTVar1 = end(in_RDI);
    *pTVar1 = *in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }